

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskImage.hpp
# Opt level: O0

void __thiscall
Storage::Disk::DiskImageHolder<Storage::Disk::NIB>::DiskImageHolder<std::__cxx11::string_const&>
          (DiskImageHolder<Storage::Disk::NIB> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  DiskImageHolder<Storage::Disk::NIB> *this_local;
  
  DiskImageHolderBase::DiskImageHolderBase(&this->super_DiskImageHolderBase);
  TargetPlatform::TypeDistinguisher::TypeDistinguisher(&this->super_TypeDistinguisher);
  (this->super_DiskImageHolderBase).super_Disk._vptr_Disk =
       (_func_int **)&PTR__DiskImageHolder_00c96600;
  (this->super_TypeDistinguisher)._vptr_TypeDistinguisher = (_func_int **)&DAT_00c96660;
  NIB::NIB(&this->disk_image_,args);
  return;
}

Assistant:

DiskImageHolder(Ts&&... args) :
			disk_image_(args...) {}